

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

Status __thiscall leveldb::anon_unknown_1::PosixEnv::GetTestDirectory(PosixEnv *this,string *result)

{
  char *pcVar1;
  __uid_t _Var2;
  char *__s;
  ulong in_RDX;
  char buf [100];
  void *local_a0;
  char local_98 [112];
  
  __s = getenv("TEST_TMPDIR");
  if ((__s == (char *)0x0) || (*__s == '\0')) {
    _Var2 = geteuid();
    __s = local_98;
    snprintf(__s,100,"/tmp/leveldbtest-%d",(ulong)_Var2);
  }
  pcVar1 = *(char **)(in_RDX + 8);
  strlen(__s);
  std::__cxx11::string::_M_replace(in_RDX,0,pcVar1,(ulong)__s);
  (**(code **)((result->_M_dataplus)._M_p + 0x48))(&local_a0,result);
  if (local_a0 != (void *)0x0) {
    operator_delete__(local_a0);
  }
  (this->super_Env)._vptr_Env = (_func_int **)0x0;
  return (Status)(char *)this;
}

Assistant:

Status GetTestDirectory(std::string* result) override {
    const char* env = std::getenv("TEST_TMPDIR");
    if (env && env[0] != '\0') {
      *result = env;
    } else {
      char buf[100];
      std::snprintf(buf, sizeof(buf), "/tmp/leveldbtest-%d",
                    static_cast<int>(::geteuid()));
      *result = buf;
    }

    // The CreateDir status is ignored because the directory may already exist.
    CreateDir(*result);

    return Status::OK();
  }